

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O0

shared_sstring_view *
anon_unknown.dwarf_211f4e::SStringViewArchive::make_shared_sstring_view
          (shared_sstring_view *__return_storage_ptr__,char *s)

{
  void *pvVar1;
  char *__last;
  element_type *__result;
  shared_ptr<const_char> local_58 [2];
  undefined1 local_30 [8];
  shared_ptr<char> ptr;
  size_t length;
  char *s_local;
  
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)strlen(s);
  pvVar1 = operator_new__((ulong)ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
  std::shared_ptr<char>::
  shared_ptr<char,(anonymous_namespace)::SStringViewArchive::make_shared_sstring_view(char_const*)::__0,void>
            ((shared_ptr<char> *)local_30,pvVar1);
  __last = s + (long)ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __result = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::copy<char_const*,char*>(s,__last,__result);
  std::shared_ptr<char_const>::shared_ptr<char,void>
            ((shared_ptr<char_const> *)local_58,(shared_ptr<char> *)local_30);
  pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
            (__return_storage_ptr__,local_58,
             (size_type)ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  std::shared_ptr<const_char>::~shared_ptr(local_58);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

shared_sstring_view SStringViewArchive::make_shared_sstring_view (char const * s) {
        auto const length = std::strlen (s);
        auto ptr = std::shared_ptr<char> (new char[length], [] (char * p) { delete[] p; });
        std::copy (s, s + length, ptr.get ());
        return {ptr, length};
    }